

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii.cc
# Opt level: O1

void absl::lts_20250127::ascii_internal::AsciiStrCaseFold<false>
               (Nonnull<char_*> dst,Nullable<const_char_*> src,size_t size)

{
  size_t i;
  size_t sVar1;
  
  if (size < 0x10) {
    if (size != 0) {
      sVar1 = 0;
      do {
        dst[sVar1] = ((byte)(src[sVar1] + 0xbfU) < 0x1a) << 5 ^ src[sVar1];
        sVar1 = sVar1 + 1;
      } while (size != sVar1);
    }
  }
  else {
    sVar1 = 0;
    do {
      dst[sVar1] = ((char)(src[sVar1] + 0x3fU) < -0x66) << 5 ^ src[sVar1];
      sVar1 = sVar1 + 1;
    } while (size != sVar1);
  }
  return;
}

Assistant:

constexpr void AsciiStrCaseFold(absl::Nonnull<char*> dst,
                                absl::Nullable<const char*> src, size_t size) {
  size < 16 ? AsciiStrCaseFoldImpl<ToUpper, /*Naive=*/true>(dst, src, size)
            : AsciiStrCaseFoldImpl<ToUpper, /*Naive=*/false>(dst, src, size);
}